

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateFor(ExpressionTranslateContext *ctx,ExprFor *expression)

{
  uint loopBreakId;
  uint loopContinueId;
  uint local_38;
  uint local_34;
  
  local_38 = ctx->nextLoopBreakId;
  ctx->nextLoopBreakId = local_38 + 1;
  local_34 = ctx->nextLoopContinueId;
  ctx->nextLoopContinueId = local_34 + 1;
  SmallArray<unsigned_int,_32U>::push_back(&ctx->loopBreakIdStack,&local_38);
  SmallArray<unsigned_int,_32U>::push_back(&ctx->loopContinueIdStack,&local_34);
  Translate(ctx,expression->initializer);
  Print(ctx,";");
  PrintLine(ctx);
  PrintIndent(ctx);
  Print(ctx,"while(");
  Translate(ctx,expression->condition);
  Print(ctx,")");
  PrintLine(ctx);
  PrintIndentedLine(ctx,"{");
  ctx->depth = ctx->depth + 1;
  PrintIndent(ctx);
  Translate(ctx,expression->body);
  Print(ctx,";");
  PrintLine(ctx);
  Print(ctx,"continue_%d:;",(ulong)local_34);
  PrintLine(ctx);
  PrintIndentedLine(ctx,"// Increment");
  PrintIndent(ctx);
  Translate(ctx,expression->increment);
  Print(ctx,";");
  PrintLine(ctx);
  ctx->depth = ctx->depth - 1;
  PrintIndentedLine(ctx,"}");
  Print(ctx,"break_%d:",(ulong)local_38);
  PrintLine(ctx);
  PrintIndent(ctx);
  SmallArray<unsigned_int,_32U>::pop_back(&ctx->loopBreakIdStack);
  SmallArray<unsigned_int,_32U>::pop_back(&ctx->loopContinueIdStack);
  return;
}

Assistant:

void TranslateFor(ExpressionTranslateContext &ctx, ExprFor *expression)
{
	unsigned loopBreakId = ctx.nextLoopBreakId++;
	unsigned loopContinueId = ctx.nextLoopContinueId++;
	ctx.loopBreakIdStack.push_back(loopBreakId);
	ctx.loopContinueIdStack.push_back(loopContinueId);

	Translate(ctx, expression->initializer);
	Print(ctx, ";");
	PrintLine(ctx);

	PrintIndent(ctx);
	Print(ctx, "while(");
	Translate(ctx, expression->condition);
	Print(ctx, ")");
	PrintLine(ctx);

	PrintIndentedLine(ctx, "{");
	ctx.depth++;
	PrintIndent(ctx);

	Translate(ctx, expression->body);

	Print(ctx, ";");

	PrintLine(ctx);

	Print(ctx, "continue_%d:;", loopContinueId);
	PrintLine(ctx);

	PrintIndentedLine(ctx, "// Increment");

	PrintIndent(ctx);
	Translate(ctx, expression->increment);

	Print(ctx, ";");

	PrintLine(ctx);
	ctx.depth--;
	PrintIndentedLine(ctx, "}");

	Print(ctx, "break_%d:", loopBreakId);
	PrintLine(ctx);
	PrintIndent(ctx);

	ctx.loopBreakIdStack.pop_back();
	ctx.loopContinueIdStack.pop_back();
}